

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O1

void __thiscall
basisu::vector<basisu::tree_vector_quant<basisu::vec<6U,_float>_>::tsvq_node>::push_back
          (vector<basisu::tree_vector_quant<basisu::vec<6U,_float>_>::tsvq_node> *this,
          tsvq_node *obj)

{
  uint uVar1;
  tsvq_node *ptVar2;
  uint *__dest;
  uint *__src;
  uint64_t uVar3;
  undefined4 uVar4;
  int32_t iVar5;
  uint32_t i;
  long lVar6;
  
  ptVar2 = this->m_p;
  if ((ptVar2 <= obj && ptVar2 != (tsvq_node *)0x0) && (obj < ptVar2 + this->m_size)) {
    __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x267,
                  "void basisu::vector<basisu::tree_vector_quant<basisu::vec<6, float>>::tsvq_node>::push_back(const T &) [T = basisu::tree_vector_quant<basisu::vec<6, float>>::tsvq_node]"
                 );
  }
  if (this->m_capacity <= this->m_size) {
    elemental_vector::increase_capacity
              ((elemental_vector *)this,this->m_size + 1,true,0x48,object_mover,false);
  }
  ptVar2 = this->m_p + this->m_size;
  uVar4 = *(undefined4 *)&obj->field_0x4;
  uVar3 = obj->m_weight;
  ptVar2->m_var = obj->m_var;
  *(undefined4 *)&ptVar2->field_0x4 = uVar4;
  ptVar2->m_weight = uVar3;
  lVar6 = 0;
  do {
    (ptVar2->m_origin).m_v[lVar6] = (obj->m_origin).m_v[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  iVar5 = obj->m_right_index;
  ptVar2->m_left_index = obj->m_left_index;
  ptVar2->m_right_index = iVar5;
  (ptVar2->m_training_vecs).m_p = (uint *)0x0;
  (ptVar2->m_training_vecs).m_size = 0;
  (ptVar2->m_training_vecs).m_capacity = 0;
  elemental_vector::increase_capacity
            ((elemental_vector *)&ptVar2->m_training_vecs,(obj->m_training_vecs).m_size,false,4,
             (object_mover)0x0,false);
  uVar1 = (obj->m_training_vecs).m_size;
  (ptVar2->m_training_vecs).m_size = uVar1;
  __dest = (ptVar2->m_training_vecs).m_p;
  if ((__dest != (uint *)0x0) && (__src = (obj->m_training_vecs).m_p, __src != (uint *)0x0)) {
    memcpy(__dest,__src,(ulong)uVar1 << 2);
  }
  ptVar2->m_codebook_index = obj->m_codebook_index;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

BASISU_FORCE_INLINE void push_back(const T& obj)
      {
         assert(!m_p || (&obj < m_p) || (&obj >= (m_p + m_size)));

         if (m_size >= m_capacity)
            increase_capacity(m_size + 1, true);

         scalar_type<T>::construct(m_p + m_size, obj);
         m_size++;
      }